

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-quest.c
# Opt level: O3

_Bool quest_check(player *p,monster *m)

{
  uint32_t *puVar1;
  uint uVar2;
  wchar_t wVar3;
  quest *pqVar4;
  player_upkeep *ppVar5;
  _Bool _Var6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  wchar_t *pwVar10;
  loc grid;
  bool bVar11;
  loc_conflict new_grid;
  loc local_30;
  
  uVar7 = (ulong)z_info->quest_max;
  iVar8 = 0;
  if (uVar7 != 0) {
    uVar2 = cave->depth;
    pqVar4 = p->quests;
    uVar9 = 0;
    bVar11 = false;
    do {
      pwVar10 = &pqVar4[uVar9].max_num;
      while( true ) {
        uVar9 = uVar9 + 1;
        if (((uVar2 == *(byte *)(pwVar10 + -5)) && (m->race == *(monster_race **)(pwVar10 + -3))) &&
           (wVar3 = pwVar10[-1], pwVar10[-1] = wVar3 + L'\x01', wVar3 + L'\x01' == *pwVar10)) break;
        iVar8 = (iVar8 + 1) - (uint)(*(byte *)(pwVar10 + -5) == 0);
        pwVar10 = pwVar10 + 0xc;
        if (uVar9 == uVar7) {
          if (bVar11) goto LAB_001a80c1;
          iVar8 = 0;
          goto LAB_001a81a3;
        }
      }
      *(uint8_t *)(pwVar10 + -5) = '\0';
      bVar11 = true;
    } while (uVar9 != uVar7);
LAB_001a80c1:
    grid.x = (m->grid).x;
    grid.y = (m->grid).y;
    local_30.x = (p->grid).x;
    local_30.y = (p->grid).y;
    _Var6 = square_changeable(cave,grid);
    if (!_Var6) {
      do {
        _Var6 = square_ispassable(cave,grid);
        if ((!_Var6) || (_Var6 = square_isdoor(cave,grid), _Var6)) break;
        scatter(cave,&local_30,grid,L'\x01',false);
        grid = local_30;
        _Var6 = square_changeable(cave,local_30);
      } while (!_Var6);
    }
    push_object(grid);
    msg("A magical staircase appears...");
    square_set_feat(cave,grid,L'\x06');
    ppVar5 = p->upkeep;
    puVar1 = &ppVar5->update;
    *puVar1 = *puVar1 | 0x60;
    bVar11 = iVar8 == 0;
    iVar8 = 1;
    if (bVar11) {
      p->total_winner = 1;
      puVar1 = &ppVar5->redraw;
      *(byte *)puVar1 = (byte)*puVar1 | 2;
      msg("*** CONGRATULATIONS ***");
      msg("You have won the game!");
      msg("You may retire (key is shift-q) when you are ready.");
    }
  }
LAB_001a81a3:
  return SUB41(iVar8,0);
}

Assistant:

bool quest_check(struct player *p, const struct monster *m)
{
	int i, total = 0;
	bool completed = false;

	/* Mark quests as complete */
	for (i = 0; i < z_info->quest_max; i++) {
		/* Note completed quests */
		if (cave->depth == p->quests[i].level &&
		    m->race == p->quests[i].race) {
			p->quests[i].cur_num++;

			if (p->quests[i].cur_num == p->quests[i].max_num) {
				p->quests[i].level = 0;
				completed = true;
			}
		}

		/* Count incomplete quests */
		if (p->quests[i].level) total++;
	}

	if (completed) {
		/* Build magical stairs */
		build_quest_stairs(p, m->grid);

		/* Nothing left, game over... */
		if (total == 0) {
			p->total_winner = true;
			p->upkeep->redraw |= (PR_TITLE);
			msg("*** CONGRATULATIONS ***");
			msg("You have won the game!");
			msg("You may retire (key is shift-q) when you are ready.");
		}

		return true;
	} else {
		return false;
	}
}